

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
kj::Vector<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry>::setCapacity
          (Vector<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> *this,
          size_t newSize)

{
  Entry *pEVar1;
  RemoveConst<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> *pRVar2;
  ulong uVar3;
  Entry *pEVar4;
  __off_t in_RDX;
  ArrayBuilder<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> local_38;
  
  uVar3 = ((long)(this->builder).pos - (long)(this->builder).ptr >> 3) * -0x5555555555555555;
  if (newSize <= uVar3 && uVar3 - newSize != 0) {
    ArrayBuilder<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry>::truncate
              (&this->builder,(char *)newSize,in_RDX);
  }
  local_38.ptr = (Entry *)kj::_::HeapArrayDisposer::allocateImpl
                                    (0x18,0,newSize,(_func_void_void_ptr *)0x0,
                                     (_func_void_void_ptr *)0x0);
  local_38.endPtr = local_38.ptr + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pEVar1 = (this->builder).pos;
  local_38.pos = local_38.ptr;
  for (pEVar4 = (this->builder).ptr; pEVar4 != pEVar1; pEVar4 = pEVar4 + 1) {
    (local_38.pos)->key = pEVar4->key;
    ((local_38.pos)->value).disposer = (pEVar4->value).disposer;
    ((local_38.pos)->value).ptr = (pEVar4->value).ptr;
    (pEVar4->value).ptr = (SegmentReader *)0x0;
    local_38.pos = local_38.pos + 1;
  }
  ArrayBuilder<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry>::operator=
            (&this->builder,&local_38);
  pEVar1 = local_38.endPtr;
  pRVar2 = local_38.pos;
  pEVar4 = local_38.ptr;
  if (local_38.ptr != (Entry *)0x0) {
    local_38.ptr = (Entry *)0x0;
    local_38.pos = (RemoveConst<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry>
                    *)0x0;
    local_38.endPtr = (Entry *)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,pEVar4,0x18,
               ((long)pRVar2 - (long)pEVar4 >> 3) * -0x5555555555555555,
               ((long)pEVar1 - (long)pEVar4 >> 3) * -0x5555555555555555,
               ArrayDisposer::
               Dispose_<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry,_false>
               ::destruct);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }